

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
is_before_in_totally_ordered_filtration::operator()
          (is_before_in_totally_ordered_filtration *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  double dVar1;
  bool bVar2;
  reference ppVar3;
  Simplex_handle local_28;
  Simplex_handle local_20;
  
  ppVar3 = boost::container::dtl::
           iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
           ::operator*(sh1);
  dVar1 = (ppVar3->second).super_Filtration_simplex_base.filt_;
  ppVar3 = boost::container::dtl::
           iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
           ::operator*(sh2);
  if ((dVar1 != (ppVar3->second).super_Filtration_simplex_base.filt_) ||
     (NAN(dVar1) || NAN((ppVar3->second).super_Filtration_simplex_base.filt_))) {
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator*(sh1);
    dVar1 = (ppVar3->second).super_Filtration_simplex_base.filt_;
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator*(sh2);
    bVar2 = dVar1 < (ppVar3->second).super_Filtration_simplex_base.filt_;
  }
  else {
    local_20 = (Simplex_handle)(sh1->m_iit).members_.nodeptr_;
    local_28 = (Simplex_handle)(sh2->m_iit).members_.nodeptr_;
    bVar2 = reverse_lexicographic_order(this->st_,&local_20,&local_28);
  }
  return bVar2;
}

Assistant:

bool operator()(const Simplex_handle sh1, const Simplex_handle sh2) const {
      // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
      if (!(sh1->second.filtration() == sh2->second.filtration())) {
        return sh1->second.filtration() < sh2->second.filtration();
      }
      // is sh1 a proper subface of sh2
      return st_->reverse_lexicographic_order(sh1, sh2);
    }